

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.c
# Opt level: O1

Generator * gen_new(char *name,_func_void_void_ptr *f,void *args,size_t args_size)

{
  int iVar1;
  Generator *fbr;
  void *__dest;
  void *args_dest;
  undefined8 *local_30;
  
  fbr = (Generator *)calloc(1,0x78);
  (fbr->result).u64 = 0;
  fbr->name = name;
  iVar1 = gen_next_id + 1;
  fbr->id = gen_next_id;
  gen_next_id = iVar1;
  fbr->done = false;
  fbr->should_finish = false;
  __dest = calloc(1,args_size);
  memcpy(__dest,args,args_size);
  fiber_alloc((Fiber *)fbr,0x4000,fiber_guard,(void *)0x0,8);
  fiber_reserve_return((Fiber *)fbr,gen_start,&local_30,0x10);
  *local_30 = f;
  local_30[1] = __dest;
  return fbr;
}

Assistant:

static Generator *
gen_new(const char *name, void (*f)(void *), void *args, size_t args_size)
{
    Generator *gen = hu_cxx_static_cast(Generator *, calloc(1, sizeof *gen));
    zero_value(&gen->result);
    gen->name = name;
    gen->id = gen_next_id++;
    gen->done = false;
    gen->should_finish = false;

    GeneratorArgs gen_args;
    gen_args.entry = f;
    gen_args.args = calloc(1, args_size);
    memcpy(gen_args.args, args, args_size);

    (void) fiber_alloc(
      &gen->fiber, STACK_SIZE, fiber_guard, NULL, FIBER_FLAG_GUARD_LO);
    fiber_push_return(&gen->fiber, gen_start, &gen_args, sizeof gen_args);
    return gen;
}